

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

int NewSessionCallback(SSL *ssl,SSL_SESSION *session)

{
  int iVar1;
  SSL_SESSION *pSVar2;
  TestState *pTVar3;
  
  iVar1 = SSL_in_init(ssl);
  if (iVar1 == 0) {
    pSVar2 = SSL_get_session((SSL *)ssl);
    if (pSVar2 != (SSL_SESSION *)0x0) {
      pTVar3 = GetTestState(ssl);
      pTVar3->got_new_session = true;
      pTVar3 = GetTestState(ssl);
      std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)&pTVar3->new_session,
                 session);
      return 1;
    }
  }
  fwrite("Invalid state for NewSessionCallback.\n",0x26,1,_stderr);
  abort();
}

Assistant:

static int NewSessionCallback(SSL *ssl, SSL_SESSION *session) {
  // This callback is called as the handshake completes. |SSL_get_session|
  // must continue to work and, historically, |SSL_in_init| returned false at
  // this point.
  if (SSL_in_init(ssl) || SSL_get_session(ssl) == nullptr) {
    fprintf(stderr, "Invalid state for NewSessionCallback.\n");
    abort();
  }

  GetTestState(ssl)->got_new_session = true;
  GetTestState(ssl)->new_session.reset(session);
  return 1;
}